

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

bool __thiscall
__gnu_cxx::__ops::
_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
::operator()(_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
             *this,__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                   __it)

{
  _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
  *p_Var1;
  long *in_RDX;
  
  if (*(char *)((long)in_RDX + 0x4f) == '\x01') {
    p_Var1 = (_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
              *)*in_RDX;
    if (p_Var1 == (_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
                   *)0x7fffffffffffffff) {
      return false;
    }
    if (*(char *)((long)in_RDX + 0x4d) == '\x03') {
      return false;
    }
    if ((long)p_Var1 < (long)this) {
      return true;
    }
    if (p_Var1 == this && *(byte *)(in_RDX + 6) == 5) {
      return true;
    }
    if (((*(byte *)(in_RDX + 6) & 0xfe) == 6 && (char)__it._M_current == '\x02') &&
       (*(int *)((long)in_RDX + 0x3c) < *(int *)((long)in_RDX + 0x44))) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool iteratingTimeGrantCheck(const DependencyInfo& dep,
                                    Time desiredGrantTime,
                                    GrantDelayMode delayMode)
{
    if (!dep.dependency || dep.next >= cBigTime) {
        return true;
    }
    if (dep.connection == ConnectionType::SELF) {
        return true;
    }
    if (dep.next < desiredGrantTime) {
        return false;
    }
    if ((dep.next == desiredGrantTime) && (dep.mTimeState == TimeState::time_granted)) {
        return false;
    }
    if (delayMode == GrantDelayMode::WAITING) {
        if (dep.mTimeState == TimeState::time_requested_iterative ||
            dep.mTimeState == TimeState::time_requested_require_iteration) {
            if (dep.sequenceCounter < dep.grantedIteration) {
                return false;
            }
        }
    }
    return true;
}